

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O3

InplaceStr GetFunctionContextTypeName(ExpressionContext *ctx,InplaceStr functionName,uint index)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  byte *pbVar4;
  size_t sVar5;
  byte *pbVar6;
  byte *pbVar7;
  char *unaff_RBX;
  uint uVar8;
  char *unaff_R12;
  ulong uVar9;
  InplaceStr IVar10;
  InplaceStr IVar11;
  byte local_38;
  byte local_37 [15];
  
  bVar1 = *functionName.begin;
  if ((((char)bVar1 < 'A' && bVar1 != 0x24) ||
      ((bVar1 - 0x5e < 0x21 && ((0x140000001U >> ((ulong)(bVar1 - 0x5e) & 0x3f) & 1) != 0)))) &&
     (IVar10.end = unaff_R12, IVar10.begin = unaff_RBX, IVar10 = GetOperatorName(IVar10),
     IVar10.begin != IVar10.end)) {
    functionName = IVar10;
  }
  uVar9 = (long)functionName.end - (long)functionName.begin;
  uVar8 = (int)uVar9 + 0x21;
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)uVar8);
  IVar11.begin = (char *)CONCAT44(extraout_var,iVar3);
  IVar11.begin[0] = '_';
  IVar11.begin[1] = '_';
  uVar9 = uVar9 & 0xffffffff;
  memcpy(IVar11.begin + 2,functionName.begin,uVar9);
  IVar11.begin[uVar9 + 2] = '_';
  pbVar4 = local_37;
  local_38 = (char)index + (char)(index / 10) * -10 | 0x30;
  if (9 < index) {
    do {
      *pbVar4 = (char)(index / 10) + (char)(((ulong)index / 10) * 0x1999999a >> 0x20) * -10 | 0x30;
      pbVar4 = pbVar4 + 1;
      bVar2 = 99 < index;
      index = index / 10;
    } while (bVar2);
  }
  pbVar7 = (byte *)(IVar11.begin + uVar9 + 3);
  do {
    pbVar6 = pbVar7;
    pbVar7 = pbVar4 + -1;
    pbVar4 = pbVar4 + -1;
    *pbVar6 = *pbVar7;
    pbVar7 = pbVar6 + 1;
  } while (pbVar4 != &local_38);
  pbVar7[0] = 0x5f;
  pbVar7[1] = 99;
  pbVar7[2] = 0x6c;
  pbVar7[3] = 0x73;
  pbVar6[5] = 0;
  sVar5 = strlen(IVar11.begin);
  if (uVar8 <= sVar5) {
    __assert_fail("strlen(name) < nameLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                  ,0x18e,
                  "InplaceStr GetFunctionContextTypeName(ExpressionContext &, InplaceStr, unsigned int)"
                 );
  }
  IVar11.end = IVar11.begin + sVar5;
  return IVar11;
}

Assistant:

InplaceStr GetFunctionContextTypeName(ExpressionContext &ctx, InplaceStr functionName, unsigned index)
{
	if((*functionName.begin <= '@' && *functionName.begin != '$') || *functionName.begin == '|' || *functionName.begin == '^' || *functionName.begin == '~')
	{
		InplaceStr operatorName = GetOperatorName(functionName);

		if(!operatorName.empty())
			functionName = operatorName;
	}

	unsigned nameLength = functionName.length() + 32 + 1;
	char *name = (char*)ctx.allocator->alloc(nameLength);

	char *pos = name;

	*pos++ = '_';
	*pos++ = '_';

	memcpy(pos, functionName.begin, functionName.length());
	pos += functionName.length();

	*pos++ = '_';
	pos = NameWriteUnsigned(pos, index);

	strcpy(pos, "_cls");
	pos += strlen("_cls");

	*pos++ = 0;

	assert(strlen(name) < nameLength);
	return InplaceStr(name);
}